

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
clean(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
      *this,Lit *idx)

{
  vec<Glucose::Solver::Watcher> *pvVar1;
  vec<Glucose::Solver::Watcher> *pvVar2;
  Watcher *pWVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  pvVar2 = (this->occs).data;
  pvVar1 = pvVar2 + idx->x;
  iVar6 = pvVar2[idx->x].sz;
  lVar4 = 0;
  iVar5 = 0;
  if (0 < iVar6) {
    iVar5 = 0;
    do {
      pWVar3 = pvVar1->data;
      if (((((this->deleted).ca)->super_RegionAllocator<unsigned_int>).memory[pWVar3[lVar4].cref] &
          3) != 1) {
        lVar7 = (long)iVar5;
        iVar5 = iVar5 + 1;
        pWVar3[lVar7] = pWVar3[lVar4];
      }
      lVar4 = lVar4 + 1;
      iVar6 = pvVar1->sz;
    } while (lVar4 < iVar6);
    iVar5 = (int)lVar4 - iVar5;
  }
  if (0 < iVar5) {
    pvVar1->sz = iVar6 - iVar5;
  }
  (this->dirty).data[idx->x] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}